

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxchangebasis.hpp
# Opt level: O1

void __thiscall
soplex::
SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::removedRow(SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,int i)

{
  long lVar1;
  Representation RVar2;
  SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar3;
  Status *pSVar4;
  SPxId *pSVar5;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pSVar6;
  long lVar7;
  long lVar8;
  int iVar9;
  long lVar10;
  SPxId id;
  DataKey local_40;
  SPxRowId local_38;
  
  RVar2 = this->theLP->theRep;
  if (RVar2 == ROW) {
    if ((this->thedesc).rowstat.data[i] < ~P_FREE) {
      if (this->thestatus != NO_PROBLEM) {
        this->thestatus = NO_PROBLEM;
        invalidate(this);
      }
      this->factorized = false;
    }
  }
  else {
    this->factorized = false;
    if (RVar2 * (this->thedesc).rowstat.data[i] < 1) {
      if (this->thestatus != NO_PROBLEM) {
        this->thestatus = NO_PROBLEM;
        invalidate(this);
      }
    }
    else if ((NO_PROBLEM < this->thestatus) && (this->matrixIsSetup == true)) {
      iVar9 = (this->theLP->thecovectors->set).thenum;
      lVar7 = (long)iVar9;
      if (-1 < lVar7) {
        lVar8 = lVar7 * 8;
        lVar10 = 1;
        do {
          local_40 = *(DataKey *)((long)&(((this->theBaseId).data)->super_DataKey).info + lVar8);
          if ((local_40.info < 0) &&
             (pSVar3 = this->theLP, SPxRowId::SPxRowId(&local_38,(SPxId *)&local_40),
             (pSVar3->
             super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).
             super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .
             super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .set.theitem[local_38.super_DataKey.idx].info < 0)) {
            pSVar5 = (this->theBaseId).data;
            *(DataKey *)((long)&(pSVar5->super_DataKey).info + lVar8) =
                 pSVar5[(this->theLP->thecovectors->set).thenum].super_DataKey;
            if (iVar9 < (this->theLP->thecovectors->set).thenum) {
              pSVar6 = SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ::vector(this->theLP,
                                (SPxId *)((long)&(((this->theBaseId).data)->super_DataKey).info +
                                         lVar8));
              *(SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                **)((long)(this->matrix).data + lVar8) = pSVar6;
            }
            break;
          }
          lVar8 = lVar8 + -8;
          iVar9 = iVar9 + -1;
          lVar1 = lVar10 + lVar7;
          lVar10 = lVar10 + -1;
        } while (lVar1 != 1 && -1 < lVar1 + -1);
      }
    }
  }
  pSVar4 = (this->thedesc).rowstat.data;
  pSVar4[i] = pSVar4[(this->theLP->
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ).
                     super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .
                     super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     .set.thenum];
  reDim(this);
  return;
}

Assistant:

void SPxBasisBase<R>::removedRow(int i)
{

   assert(status() >  NO_PROBLEM);
   assert(theLP    != nullptr);

   if(theLP->rep() == SPxSolverBase<R>::ROW)
   {
      if(theLP->isBasic(thedesc.rowStatus(i)))
      {
         setStatus(NO_PROBLEM);
         factorized = false;

         SPxOut::debug(this, "DCHBAS05 Warning: deleting basic row!\n");
      }
   }
   else
   {
      assert(theLP->rep() == SPxSolverBase<R>::COLUMN);
      factorized = false;

      if(!theLP->isBasic(thedesc.rowStatus(i)))
      {
         setStatus(NO_PROBLEM);
         SPxOut::debug(this, "DCHBAS06 Warning: deleting nonbasic row!\n");
      }
      else if(status() > NO_PROBLEM && matrixIsSetup)
      {
         for(int j = theLP->dim(); j >= 0; --j)
         {
            SPxId id = baseId(j);

            if(id.isSPxRowId() && !theLP->has(SPxRowId(id)))
            {
               baseId(j) = baseId(theLP->dim());

               if(j < theLP->dim())
                  matrix[j] = &theLP->vector(baseId(j));

               break;
            }
         }
      }
   }

   thedesc.rowStatus(i) = thedesc.rowStatus(theLP->nRows());
   reDim();
}